

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryUnorderedTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true>::TryUndeleteProperty
          (SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *object,int existingPropertyIndex,int *propertyIndex)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  SimpleDictionaryPropertyDescriptor<int> *pSVar6;
  PropertyRecord **ppPVar7;
  char *message;
  char *error;
  uint lineNumber;
  SimpleDictionaryPropertyDescriptor<int> local_50;
  SimpleDictionaryPropertyDescriptor<int> descriptorToPreserve;
  PropertyRecord *propertyKeyToReuse;
  PropertyRecord *propertyKeyToPreserve;
  SimpleDictionaryPropertyDescriptor<int> descriptorToReuse;
  
  if (object == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x5c,"(object)","object");
    if (!bVar2) goto LAB_00e4cd86;
    *puVar5 = 0;
  }
  if (propertyIndex == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,0x5d,"(propertyIndex)","propertyIndex");
    if (!bVar2) goto LAB_00e4cd86;
    *puVar5 = 0;
  }
  bVar2 = IsReusablePropertyIndex(this,existingPropertyIndex);
  if (bVar2) {
    pSVar6 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
             ::GetValueAt((this->
                          super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>
                          ).propertyMap.ptr,existingPropertyIndex);
    if (pSVar6->propertyIndex != existingPropertyIndex) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                  ,100,
                                  "(this->propertyMap->GetValueAt(existingPropertyIndex).propertyIndex == existingPropertyIndex)"
                                  ,
                                  "this->propertyMap->GetValueAt(existingPropertyIndex).propertyIndex == existingPropertyIndex"
                                 );
      if (!bVar2) goto LAB_00e4cd86;
      *puVar5 = 0;
    }
    pSVar6 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
             ::GetValueAt((this->
                          super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>
                          ).propertyMap.ptr,existingPropertyIndex);
    if ((pSVar6->Attributes & 8) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                  ,0x65,
                                  "(this->propertyMap->GetValueAt(existingPropertyIndex).Attributes & 0x08)"
                                  ,
                                  "this->propertyMap->GetValueAt(existingPropertyIndex).Attributes & PropertyDeleted"
                                 );
      if (!bVar2) goto LAB_00e4cd86;
      *puVar5 = 0;
    }
    bVar2 = TryReuseDeletedPropertyIndex(this,object,propertyIndex);
    if (bVar2) {
      if (*propertyIndex == existingPropertyIndex) {
        return bVar2;
      }
      ppPVar7 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                ::GetKeyAt((this->
                           super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>
                           ).propertyMap.ptr,*propertyIndex);
      propertyKeyToReuse = *ppPVar7;
      pSVar6 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt((this->
                            super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>
                            ).propertyMap.ptr,*propertyIndex);
      local_50._0_4_ = SUB84(*pSVar6,0);
      local_50.propertyIndex = existingPropertyIndex;
      pSVar6 = (SimpleDictionaryPropertyDescriptor<int> *)
               JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
               ::GetKeyAt((this->
                          super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>
                          ).propertyMap.ptr,existingPropertyIndex);
      descriptorToPreserve = *pSVar6;
      pSVar6 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
               ::GetValueAt((this->
                            super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>
                            ).propertyMap.ptr,existingPropertyIndex);
      propertyKeyToPreserve = (PropertyRecord *)CONCAT44(*propertyIndex,SUB84(*pSVar6,0));
      JsUtil::
      BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
      ::Remove((this->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
               propertyMap.ptr,&propertyKeyToReuse);
      JsUtil::
      BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
      ::Remove((this->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
               propertyMap.ptr,(PropertyRecord **)&descriptorToPreserve);
      iVar4 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
              ::
              Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>::InsertOperations)0>
                        ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                          *)(this->
                            super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>
                            ).propertyMap.ptr,&propertyKeyToReuse,&local_50);
      if (iVar4 != existingPropertyIndex) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                    ,0x86,"(dictionaryIndex == existingPropertyIndex)",
                                    "dictionaryIndex == existingPropertyIndex");
        if (!bVar3) goto LAB_00e4cd86;
        *puVar5 = 0;
      }
      iVar4 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
              ::
              Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>::InsertOperations)0>
                        ((BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
                          *)(this->
                            super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>
                            ).propertyMap.ptr,(PropertyRecord **)&descriptorToPreserve,
                         (SimpleDictionaryPropertyDescriptor<int> *)&propertyKeyToPreserve);
      if (iVar4 == *propertyIndex) {
        return bVar2;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      error = "(dictionaryIndex == *propertyIndex)";
      message = "dictionaryIndex == *propertyIndex";
      lineNumber = 0x88;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      error = "(0)";
      message = "0";
      lineNumber = 0x6a;
    }
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryUnorderedTypeHandler.cpp"
                                ,lineNumber,error,message);
    if (!bVar3) {
LAB_00e4cd86:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TryUndeleteProperty(
        DynamicObject *const object,
        const TPropertyIndex existingPropertyIndex,
        TPropertyIndex *const propertyIndex)
    {
        Assert(object);
        Assert(propertyIndex);

        if(!IsReusablePropertyIndex(existingPropertyIndex))
        {
            return false;
        }

        Assert(this->propertyMap->GetValueAt(existingPropertyIndex).propertyIndex == existingPropertyIndex);
        Assert(this->propertyMap->GetValueAt(existingPropertyIndex).Attributes & PropertyDeleted);

        const bool reused = TryReuseDeletedPropertyIndex(object, propertyIndex);
        if (!reused)
        {
            Assert(0); // at least one property index must have been free-listed since we're adding an existing deleted property
            return false;
        }

        if(*propertyIndex == existingPropertyIndex)
        {
            // The deleted property index that is being added is the first deleted property index in the free-list
            return true;
        }

        // We're trying to add a deleted property index that is currently somewhere in the middle of the free-list chain. To
        // avoid rebuilding the free-list, swap the property descriptor with the one for the first deleted property index in the
        // free-list. Since we also need to make sure that each descriptor's property index is the same as its dictionary entry
        // index, we need to remove them from the dictionary and add them back in the same order, which actually adds them in
        // reverse order. This relies on the fact that BaseDictionary first reuses the last-deleted entry index in its
        // free-listing strategy. Should remove this dependence in the future.

        TMapKey propertyKeyToPreserve = this->propertyMap->GetKeyAt(*propertyIndex);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptorToPreserve = this->propertyMap->GetValueAt(*propertyIndex);
        descriptorToPreserve.propertyIndex = existingPropertyIndex;

        TMapKey propertyKeyToReuse = this->propertyMap->GetKeyAt(existingPropertyIndex);
        SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptorToReuse = this->propertyMap->GetValueAt(existingPropertyIndex);
        descriptorToReuse.propertyIndex = *propertyIndex;

        this->propertyMap->Remove(propertyKeyToPreserve);
        this->propertyMap->Remove(propertyKeyToReuse);
        int dictionaryIndex = this->propertyMap->Add(propertyKeyToPreserve, descriptorToPreserve);
        Assert(dictionaryIndex == existingPropertyIndex);
        dictionaryIndex = this->propertyMap->Add(propertyKeyToReuse, descriptorToReuse);
        Assert(dictionaryIndex == *propertyIndex);

        return true;
    }